

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 MillisecondsWidth *msWidth)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  byte *pbVar12;
  byte local_50 [7];
  byte abStack_49 [9];
  ulong local_40;
  MillisecondsWidth *local_38;
  
  local_38 = msWidth;
  local_40 = msec;
  pbVar9 = (byte *)(buf + bufSz);
LAB_001154e3:
  if (*format == 0x25) {
    pbVar12 = (byte *)format + 1;
    bVar1 = ((byte *)format)[1];
    pbVar10 = (byte *)buf;
    if (bVar1 < 0x61) {
      if (bVar1 < 0x41) {
        if ((bVar1 == 0) || (format = (char *)pbVar12, bVar1 == 0x25)) goto LAB_001154f3;
      }
      else {
        switch(bVar1) {
        case 0x41:
          if (buf < pbVar9) {
            pbVar7 = _ZN2el4base6constsL5kDaysE_rel +
                     *(int *)(_ZN2el4base6constsL5kDaysE_rel + (long)tInfo->tm_wday * 4);
            do {
              bVar1 = *pbVar7;
              *buf = bVar1;
              pbVar10 = (byte *)buf;
              if (bVar1 == 0) break;
              pbVar7 = pbVar7 + 1;
              buf = (char *)((byte *)buf + 1);
              pbVar10 = pbVar9;
            } while ((byte *)buf != pbVar9);
          }
          break;
        case 0x42:
          if (buf < pbVar9) {
            pbVar7 = _ZN2el4base6constsL7kMonthsE_rel +
                     *(int *)(_ZN2el4base6constsL7kMonthsE_rel + (long)tInfo->tm_mon * 4);
            do {
              bVar1 = *pbVar7;
              *buf = bVar1;
              pbVar10 = (byte *)buf;
              if (bVar1 == 0) break;
              pbVar7 = pbVar7 + 1;
              buf = (char *)((byte *)buf + 1);
              pbVar10 = pbVar9;
            } while ((byte *)buf != pbVar9);
          }
          break;
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x47:
          break;
        case 0x46:
          if (buf < pbVar9) {
            pcVar5 = "AM";
            if (0xb < tInfo->tm_hour) {
              pcVar5 = "PM";
            }
            do {
              bVar1 = *pcVar5;
              *buf = bVar1;
              pbVar10 = (byte *)buf;
              if (bVar1 == 0) break;
              pcVar5 = (char *)((byte *)pcVar5 + 1);
              buf = (char *)((byte *)buf + 1);
              pbVar10 = pbVar9;
            } while ((byte *)buf != pbVar9);
          }
          break;
        case 0x48:
          abStack_49[1] = 0;
          abStack_49[2] = 0;
          if ((long)tInfo->tm_hour == 0) {
            uVar11 = 1;
            pbVar7 = abStack_49;
            goto LAB_00115cc9;
          }
          uVar6 = (long)tInfo->tm_hour;
          pbVar8 = abStack_49;
          uVar4 = 2;
          do {
            pbVar7 = pbVar8;
            *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
            uVar11 = uVar4 - 1;
            if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
            bVar2 = 1 < uVar4;
            uVar6 = uVar6 / 10;
            pbVar8 = pbVar7 + -1;
            uVar4 = uVar11;
          } while (bVar2);
          do {
            if (pbVar7 <= local_50) goto LAB_00115cdb;
LAB_00115cc9:
            if ((int)uVar11 < 1) goto LAB_00115cdb;
            uVar11 = uVar11 - 1;
            pbVar7[-1] = 0x30;
            pbVar7 = pbVar7 + -1;
          } while( true );
        default:
          if (bVar1 == 0x4d) {
            abStack_49[1] = 0;
            abStack_49[2] = 0;
            iVar3 = tInfo->tm_mon + 1;
            if (iVar3 != 0) {
              uVar6 = (long)iVar3;
              pbVar7 = abStack_49;
              uVar11 = 2;
              do {
                pbVar8 = pbVar7;
                *pbVar8 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
                uVar4 = uVar11 - 1;
                if (uVar6 < 10) goto LAB_00115d3e;
                if (pbVar8 <= local_50) goto LAB_00115d3e;
                bVar2 = uVar11 < 2;
                uVar6 = uVar6 / 10;
                pbVar7 = pbVar8 + -1;
                uVar11 = uVar4;
                if (bVar2) goto LAB_00115d3e;
              } while( true );
            }
            uVar4 = 1;
            pbVar8 = abStack_49;
            do {
              if ((int)uVar4 < 1) break;
              uVar4 = uVar4 - 1;
              pbVar8[-1] = 0x30;
              pbVar8 = pbVar8 + -1;
LAB_00115d3e:
            } while (local_50 < pbVar8);
            if (buf < pbVar9) {
              do {
                bVar1 = *pbVar8;
                *buf = bVar1;
                pbVar10 = (byte *)buf;
                if (bVar1 == 0) break;
                pbVar8 = pbVar8 + 1;
                buf = (char *)((byte *)buf + 1);
                pbVar10 = pbVar9;
              } while ((byte *)buf != pbVar9);
            }
          }
          else if (bVar1 == 0x59) {
            uVar6 = (long)tInfo->tm_year + 0x76c;
            abStack_49[1] = 0;
            abStack_49[2] = 0;
            if ((int)uVar6 == 0) {
              uVar11 = 3;
              pbVar7 = abStack_49;
              goto LAB_00115cfd;
            }
            pbVar8 = abStack_49;
            uVar4 = 4;
            do {
              pbVar7 = pbVar8;
              *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
              uVar11 = uVar4 - 1;
              if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
              bVar2 = 1 < uVar4;
              uVar6 = uVar6 / 10;
              pbVar8 = pbVar7 + -1;
              uVar4 = uVar11;
            } while (bVar2);
            do {
              if (pbVar7 <= local_50) goto LAB_00115d0f;
LAB_00115cfd:
              if ((int)uVar11 < 1) goto LAB_00115d0f;
              uVar11 = uVar11 - 1;
              pbVar7[-1] = 0x30;
              pbVar7 = pbVar7 + -1;
            } while( true );
          }
        }
      }
    }
    else if (bVar1 < 0x73) {
      switch(bVar1) {
      case 0x61:
        if (buf < pbVar9) {
          pbVar7 = _ZN2el4base6constsL11kDaysAbbrevE_rel +
                   *(int *)(_ZN2el4base6constsL11kDaysAbbrevE_rel + (long)tInfo->tm_wday * 4);
          do {
            bVar1 = *pbVar7;
            *buf = bVar1;
            pbVar10 = (byte *)buf;
            if (bVar1 == 0) break;
            pbVar7 = pbVar7 + 1;
            buf = (char *)((byte *)buf + 1);
            pbVar10 = pbVar9;
          } while ((byte *)buf != pbVar9);
        }
        break;
      case 0x62:
        if (buf < pbVar9) {
          pbVar7 = _ZN2el4base6constsL13kMonthsAbbrevE_rel +
                   *(int *)(_ZN2el4base6constsL13kMonthsAbbrevE_rel + (long)tInfo->tm_mon * 4);
          do {
            bVar1 = *pbVar7;
            *buf = bVar1;
            pbVar10 = (byte *)buf;
            if (bVar1 == 0) break;
            pbVar7 = pbVar7 + 1;
            buf = (char *)((byte *)buf + 1);
            pbVar10 = pbVar9;
          } while ((byte *)buf != pbVar9);
        }
        break;
      case 100:
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((long)tInfo->tm_mday == 0) {
          uVar11 = 1;
          pbVar7 = abStack_49;
          goto LAB_00115c92;
        }
        uVar6 = (long)tInfo->tm_mday;
        pbVar8 = abStack_49;
        uVar4 = 2;
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar11 = uVar4 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar4;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar4 = uVar11;
        } while (bVar2);
        do {
          if (pbVar7 <= local_50) goto LAB_00115ca4;
LAB_00115c92:
          if ((int)uVar11 < 1) goto LAB_00115ca4;
          uVar11 = uVar11 - 1;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
        } while( true );
      case 0x67:
switchD_00115533_caseD_67:
        uVar11 = msWidth->m_width;
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if (msec == 0) {
          uVar11 = uVar11 - 1;
          pbVar7 = abStack_49;
          goto LAB_00115c5b;
        }
        uVar6 = local_40;
        pbVar8 = abStack_49;
        if ((int)uVar11 < 1) {
          pbVar7 = abStack_49 + 1;
          goto LAB_00115c5b;
        }
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar4 = uVar11 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar11;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar11 = uVar4;
        } while (bVar2);
        do {
          uVar11 = uVar4;
          if (pbVar7 <= local_50) goto LAB_00115c6d;
LAB_00115c5b:
          if ((int)uVar11 < 1) goto LAB_00115c6d;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
          uVar4 = uVar11 - 1;
        } while( true );
      case 0x68:
        iVar3 = tInfo->tm_hour;
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        iVar3 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * -0xc;
        if (iVar3 == 0) {
          uVar11 = 1;
          pbVar7 = abStack_49;
          goto LAB_00115c24;
        }
        uVar6 = (long)iVar3;
        pbVar8 = abStack_49;
        uVar4 = 2;
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar11 = uVar4 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar4;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar4 = uVar11;
        } while (bVar2);
        do {
          if (pbVar7 <= local_50) goto LAB_00115c36;
LAB_00115c24:
          if ((int)uVar11 < 1) goto LAB_00115c36;
          uVar11 = uVar11 - 1;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
        } while( true );
      case 0x6d:
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((long)tInfo->tm_min == 0) {
          uVar11 = 1;
          pbVar7 = abStack_49;
          goto LAB_00115bed;
        }
        uVar6 = (long)tInfo->tm_min;
        pbVar8 = abStack_49;
        uVar4 = 2;
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar11 = uVar4 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar4;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar4 = uVar11;
        } while (bVar2);
        do {
          if (pbVar7 <= local_50) goto LAB_00115bff;
LAB_00115bed:
          if ((int)uVar11 < 1) goto LAB_00115bff;
          uVar11 = uVar11 - 1;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
        } while( true );
      }
    }
    else {
      if (bVar1 == 0x73) {
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((long)tInfo->tm_sec == 0) {
          uVar11 = 1;
          pbVar7 = abStack_49;
          goto LAB_00115bb6;
        }
        uVar6 = (long)tInfo->tm_sec;
        pbVar8 = abStack_49;
        uVar4 = 2;
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar11 = uVar4 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar4;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar4 = uVar11;
        } while (bVar2);
        do {
          if (pbVar7 <= local_50) goto LAB_00115bc8;
LAB_00115bb6:
          if ((int)uVar11 < 1) goto LAB_00115bc8;
          uVar11 = uVar11 - 1;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
        } while( true );
      }
      if (bVar1 == 0x79) {
        uVar6 = (long)tInfo->tm_year + 0x76c;
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((int)uVar6 == 0) {
          uVar11 = 1;
          pbVar7 = abStack_49;
          goto LAB_00115b7f;
        }
        pbVar8 = abStack_49;
        uVar4 = 2;
        do {
          pbVar7 = pbVar8;
          *pbVar7 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
          uVar11 = uVar4 - 1;
          if ((uVar6 < 10) || (pbVar7 <= local_50)) break;
          bVar2 = 1 < uVar4;
          uVar6 = uVar6 / 10;
          pbVar8 = pbVar7 + -1;
          uVar4 = uVar11;
        } while (bVar2);
        do {
          if (pbVar7 <= local_50) goto LAB_00115b91;
LAB_00115b7f:
          if ((int)uVar11 < 1) goto LAB_00115b91;
          uVar11 = uVar11 - 1;
          pbVar7[-1] = 0x30;
          pbVar7 = pbVar7 + -1;
        } while( true );
      }
      if (bVar1 == 0x7a) goto switchD_00115533_caseD_67;
    }
  }
  else {
    if (*format == 0) {
      return (char *)(byte *)buf;
    }
LAB_001154f3:
    if ((byte *)buf == pbVar9) {
      return (char *)(byte *)buf;
    }
    *buf = *format;
    pbVar10 = (byte *)buf + 1;
    pbVar12 = (byte *)format;
  }
  goto switchD_00115533_caseD_63;
LAB_00115d0f:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115cdb:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115bc8:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115b91:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115bff:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115c36:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115c6d:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
  goto switchD_00115533_caseD_63;
LAB_00115ca4:
  if (buf < pbVar9) {
    do {
      bVar1 = *pbVar7;
      *buf = bVar1;
      pbVar10 = (byte *)buf;
      if (bVar1 == 0) break;
      pbVar7 = pbVar7 + 1;
      buf = (char *)((byte *)buf + 1);
      pbVar10 = pbVar9;
    } while ((byte *)buf != pbVar9);
  }
switchD_00115533_caseD_63:
  format = (char *)(pbVar12 + 1);
  buf = (char *)pbVar10;
  goto LAB_001154e3;
}

Assistant:

static char* parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
            std::size_t msec, const base::MillisecondsWidth* msWidth) {
        const char* bufLim = buf + bufSz;
        for (; *format; ++format) {
            if (*format == base::consts::kFormatSpecifierChar) {
                switch (*++format) {
                case base::consts::kFormatSpecifierChar:  // Escape
                    break;
                case '\0':  // End
                    --format;
                    break;
                case 'd':  // Day
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
                    continue;
                case 'a':  // Day of week (short)
                    buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'A':  // Day of week (long)
                    buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'M':  // month
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
                    continue;
                case 'b':  // month (short)
                    buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'B':  // month (long)
                    buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'y':  // year (two digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
                    continue;
                case 'Y':  // year (four digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
                    continue;
                case 'h':  // hour (12-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
                    continue;
                case 'H':  // hour (24-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
                    continue;
                case 'm':  // minute
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
                    continue;
                case 's':  // second
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
                    continue;
                case 'z':  // milliseconds
                case 'g':
                    buf = base::utils::Str::convertAndAddToBuff(msec, msWidth->m_width, buf, bufLim);
                    continue;
                case 'F':  // AM/PM
                    buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
                    continue;
                default:
                    continue;
                }
            }
            if (buf == bufLim) break;
            *buf++ = *format;
        }
        return buf;
    }